

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NDOLoader.cpp
# Opt level: O2

void __thiscall
Assimp::NDOImporter::InternReadFile
          (NDOImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  _Rb_tree_color _Var1;
  pointer pFVar2;
  pointer pVVar3;
  pointer pEVar4;
  bool bVar5;
  bool bVar6;
  pointer __src;
  pointer paVar7;
  pointer __src_00;
  pointer puVar8;
  int8_t *piVar9;
  byte bVar10;
  char cVar11;
  uchar uVar12;
  unsigned_short uVar13;
  unsigned_short uVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  undefined4 extraout_var;
  Logger *pLVar19;
  aiNode *paVar20;
  ulong uVar21;
  aiNode **__s;
  aiMesh **__s_00;
  aiNode *this_00;
  mapped_type_conflict2 *pmVar22;
  aiMesh *this_01;
  ulong *puVar23;
  aiFace *paVar24;
  uint *puVar25;
  _Base_ptr p_Var26;
  aiVector3D *__s_01;
  DeadlyImportError *this_02;
  long lVar27;
  pointer pEVar28;
  ulong uVar29;
  aiFace *paVar30;
  size_t __n;
  mapped_type_conflict2 mVar31;
  uint e;
  uint uVar32;
  pointer pOVar33;
  bool bVar34;
  float fVar35;
  uint local_264;
  aiNode *local_260;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> vertices;
  vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_> objects;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  StreamReaderBE reader;
  FaceTable face_table;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&face_table,"rb",(allocator<char> *)&objects);
  iVar15 = (*pIOHandler->_vptr_IOSystem[4])
                     (pIOHandler,(pFile->_M_dataplus)._M_p,face_table._M_t._M_impl._0_8_);
  StreamReader<true,_false>::StreamReader(&reader,(IOStream *)CONCAT44(extraout_var,iVar15),false);
  std::__cxx11::string::~string((string *)&face_table);
  piVar9 = reader.current;
  StreamReader<true,_false>::IncPtr(&reader,9);
  iVar15 = strncmp("nendo ",piVar9,6);
  if (iVar15 != 0) {
    this_02 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&face_table,"Not a Nendo file; magic signature missing",
               (allocator<char> *)&objects);
    DeadlyImportError::DeadlyImportError(this_02,(string *)&face_table);
    __cxa_throw(this_02,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar10 = piVar9[6];
  iVar16 = -(bVar10 - 0x31);
  iVar15 = iVar16;
  if (bVar10 == 0x31) {
    if ((byte)piVar9[7] - 0x2e == 0) {
      iVar15 = 0x30 - (uint)(byte)piVar9[8];
    }
    else {
      iVar15 = -((byte)piVar9[7] - 0x2e);
    }
    if (iVar15 != 0) {
      if ((byte)piVar9[7] - 0x2e == 0) {
        iVar15 = 0x31 - (uint)(byte)piVar9[8];
      }
      else {
        iVar15 = -((byte)piVar9[7] - 0x2e);
      }
      goto LAB_003d618b;
    }
    pLVar19 = DefaultLogger::get();
    Logger::info(pLVar19,"NDO file format is 1.0");
    bVar6 = true;
  }
  else {
LAB_003d618b:
    if (iVar15 != 0) {
      if (bVar10 == 0x31) {
        if ((byte)piVar9[7] - 0x2e == 0) {
          iVar16 = 0x32 - (uint)(byte)piVar9[8];
        }
        else {
          iVar16 = -((byte)piVar9[7] - 0x2e);
        }
      }
      if (iVar16 == 0) {
        pLVar19 = DefaultLogger::get();
        Logger::info(pLVar19,"NDO file format is 1.2");
      }
      else {
        pLVar19 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[65]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &face_table,
                   (char (*) [65])"Unrecognized nendo file format version, continuing happily ... :"
                  );
        std::operator<<((ostream *)&face_table,piVar9 + 6);
        std::__cxx11::stringbuf::str();
        Logger::warn(pLVar19,(char *)objects.
                                     super__Vector_base<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
        std::__cxx11::string::~string((string *)&objects);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&face_table);
      }
      bVar5 = true;
      bVar6 = false;
      goto LAB_003d6258;
    }
    pLVar19 = DefaultLogger::get();
    Logger::info(pLVar19,"NDO file format is 1.1");
    bVar6 = false;
  }
  bVar5 = false;
LAB_003d6258:
  StreamReader<true,_false>::IncPtr(&reader,2);
  if (bVar5) {
    StreamReader<true,_false>::IncPtr(&reader,2);
  }
  bVar10 = StreamReader<true,_false>::Get<unsigned_char>(&reader);
  std::vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>::vector
            (&objects,(ulong)bVar10,(allocator_type *)&face_table);
  for (uVar17 = 0; paVar20 = (aiNode *)(ulong)uVar17,
      paVar20 < (aiNode *)
                (((long)objects.
                        super__Vector_base<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)objects.
                       super__Vector_base<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x68); uVar17 = uVar17 + 1) {
    cVar11 = StreamReader<true,_false>::Get<signed_char>(&reader);
    if (cVar11 != '\0') {
      pOVar33 = objects.
                super__Vector_base<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>
                ._M_impl.super__Vector_impl_data._M_start + (long)paVar20;
      local_260 = paVar20;
      if (bVar5) {
        uVar17 = StreamReader<true,_false>::Get<unsigned_int>(&reader);
      }
      else {
        uVar13 = StreamReader<true,_false>::Get<unsigned_short>(&reader);
        uVar17 = (uint)uVar13;
      }
      piVar9 = reader.current;
      StreamReader<true,_false>::IncPtr(&reader,(ulong)(uVar17 + 0x4c));
      face_table._M_t._M_impl._0_8_ =
           &face_table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      std::__cxx11::string::_M_construct<char_const*>((string *)&face_table,piVar9,piVar9 + uVar17);
      std::__cxx11::string::operator=((string *)pOVar33,(string *)&face_table);
      std::__cxx11::string::~string((string *)&face_table);
      if (bVar5) {
        uVar17 = StreamReader<true,_false>::Get<unsigned_int>(&reader);
      }
      else {
        uVar13 = StreamReader<true,_false>::Get<unsigned_short>(&reader);
        uVar17 = (uint)uVar13;
      }
      std::vector<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>::reserve
                (&pOVar33->edges,(ulong)uVar17);
      for (uVar32 = 0; uVar32 != uVar17; uVar32 = uVar32 + 1) {
        face_table._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ = 0;
        face_table._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ = 0;
        face_table._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
        face_table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        face_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
        face_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ = 0;
        face_table._M_t._M_impl._0_8_ = 0;
        face_table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        face_table._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        std::vector<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>::
        emplace_back<Assimp::NDOImporter::Edge>(&pOVar33->edges,(Edge *)&face_table);
        pEVar28 = (pOVar33->edges).
                  super__Vector_base<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (lVar27 = -0xb; lVar27 != -3; lVar27 = lVar27 + 1) {
          if (bVar5) {
            uVar18 = StreamReader<true,_false>::Get<unsigned_int>(&reader);
          }
          else {
            uVar13 = StreamReader<true,_false>::Get<unsigned_short>(&reader);
            uVar18 = (uint)uVar13;
          }
          pEVar28->edge[lVar27] = uVar18;
        }
        uVar18 = 0;
        if (!bVar6) {
          bVar10 = StreamReader<true,_false>::Get<unsigned_char>(&reader);
          uVar18 = (uint)bVar10;
        }
        pEVar28[-1].hard = uVar18;
        for (lVar27 = -8; lVar27 != 0; lVar27 = lVar27 + 1) {
          uVar12 = StreamReader<true,_false>::Get<unsigned_char>(&reader);
          *(uchar *)((long)pEVar28->edge + lVar27) = uVar12;
        }
      }
      if (bVar5) {
        uVar17 = StreamReader<true,_false>::Get<unsigned_int>(&reader);
      }
      else {
        uVar13 = StreamReader<true,_false>::Get<unsigned_short>(&reader);
        uVar17 = (uint)uVar13;
      }
      std::vector<Assimp::NDOImporter::Face,_std::allocator<Assimp::NDOImporter::Face>_>::reserve
                (&pOVar33->faces,(ulong)uVar17);
      while (bVar34 = uVar17 != 0, uVar17 = uVar17 - 1, bVar34) {
        face_table._M_t._M_impl._0_8_ = face_table._M_t._M_impl._0_8_ & 0xffffffff00000000;
        std::vector<Assimp::NDOImporter::Face,_std::allocator<Assimp::NDOImporter::Face>_>::
        emplace_back<Assimp::NDOImporter::Face>(&pOVar33->faces,(Face *)&face_table);
        pFVar2 = (pOVar33->faces).
                 super__Vector_base<Assimp::NDOImporter::Face,_std::allocator<Assimp::NDOImporter::Face>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (bVar5) {
          uVar32 = StreamReader<true,_false>::Get<unsigned_int>(&reader);
        }
        else {
          uVar13 = StreamReader<true,_false>::Get<unsigned_short>(&reader);
          uVar32 = (uint)uVar13;
        }
        pFVar2[-1].elem = uVar32;
      }
      if (bVar5) {
        uVar17 = StreamReader<true,_false>::Get<unsigned_int>(&reader);
      }
      else {
        uVar13 = StreamReader<true,_false>::Get<unsigned_short>(&reader);
        uVar17 = (uint)uVar13;
      }
      std::vector<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>::
      reserve(&pOVar33->vertices,(ulong)uVar17);
      while (bVar34 = uVar17 != 0, uVar17 = uVar17 - 1, bVar34) {
        face_table._M_t._M_impl._0_8_ = 0;
        face_table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        face_table._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        std::vector<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>::
        emplace_back<Assimp::NDOImporter::Vertex>(&pOVar33->vertices,(Vertex *)&face_table);
        pVVar3 = (pOVar33->vertices).
                 super__Vector_base<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (bVar5) {
          uVar32 = StreamReader<true,_false>::Get<unsigned_int>(&reader);
        }
        else {
          uVar13 = StreamReader<true,_false>::Get<unsigned_short>(&reader);
          uVar32 = (uint)uVar13;
        }
        pVVar3[-1].num = uVar32;
        fVar35 = StreamReader<true,_false>::Get<float>(&reader);
        pVVar3[-1].val.x = fVar35;
        fVar35 = StreamReader<true,_false>::Get<float>(&reader);
        pVVar3[-1].val.y = fVar35;
        fVar35 = StreamReader<true,_false>::Get<float>(&reader);
        pVVar3[-1].val.z = fVar35;
      }
      if (bVar5) {
        uVar17 = StreamReader<true,_false>::Get<unsigned_int>(&reader);
      }
      else {
        uVar13 = StreamReader<true,_false>::Get<unsigned_short>(&reader);
        uVar17 = (uint)uVar13;
      }
      while (bVar34 = uVar17 != 0, uVar17 = uVar17 - 1, bVar34) {
        if (bVar5) {
          StreamReader<true,_false>::Get<unsigned_int>(&reader);
        }
        else {
          StreamReader<true,_false>::Get<unsigned_short>(&reader);
        }
      }
      if (bVar5) {
        uVar17 = StreamReader<true,_false>::Get<unsigned_int>(&reader);
      }
      else {
        uVar13 = StreamReader<true,_false>::Get<unsigned_short>(&reader);
        uVar17 = (uint)uVar13;
      }
      while (bVar34 = uVar17 != 0, uVar17 = uVar17 - 1, bVar34) {
        if (bVar5) {
          StreamReader<true,_false>::Get<unsigned_int>(&reader);
        }
        else {
          StreamReader<true,_false>::Get<unsigned_short>(&reader);
        }
      }
      uVar12 = StreamReader<true,_false>::Get<unsigned_char>(&reader);
      uVar17 = (uint)local_260;
      if (uVar12 != '\0') {
        uVar13 = StreamReader<true,_false>::Get<unsigned_short>(&reader);
        uVar14 = StreamReader<true,_false>::Get<unsigned_short>(&reader);
        for (uVar32 = 0; uVar32 < (uint)uVar14 * (uint)uVar13; uVar32 = uVar32 + bVar10) {
          bVar10 = StreamReader<true,_false>::Get<unsigned_char>(&reader);
          StreamReader<true,_false>::Get<unsigned_char>(&reader);
          StreamReader<true,_false>::Get<unsigned_char>(&reader);
          StreamReader<true,_false>::Get<unsigned_char>(&reader);
        }
      }
    }
  }
  paVar20 = (aiNode *)operator_new(0x478);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&face_table,"$NDODummyRoot",(allocator<char> *)&vertices);
  aiNode::aiNode(paVar20,(string *)&face_table);
  pScene->mRootNode = paVar20;
  std::__cxx11::string::~string((string *)&face_table);
  uVar21 = ((long)objects.
                  super__Vector_base<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)objects.
                 super__Vector_base<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x68;
  paVar20->mNumChildren = (uint)uVar21;
  uVar21 = (uVar21 & 0xffffffff) << 3;
  __s = (aiNode **)operator_new__(uVar21);
  memset(__s,0,uVar21);
  paVar20->mChildren = __s;
  __s_00 = (aiMesh **)operator_new__(uVar21);
  memset(__s_00,0,uVar21);
  pScene->mMeshes = __s_00;
  vertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (pOVar33 = objects.
                 super__Vector_base<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pOVar33 !=
      objects.
      super__Vector_base<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>.
      _M_impl.super__Vector_impl_data._M_finish; pOVar33 = pOVar33 + 1) {
    this_00 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(this_00,&pOVar33->name);
    *__s = this_00;
    __s = __s + 1;
    face_table._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         face_table._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    face_table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    face_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &face_table._M_t._M_impl.super__Rb_tree_header._M_header;
    face_table._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
    face_table._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
    this_00->mParent = paVar20;
    pEVar4 = (pOVar33->edges).
             super__Vector_base<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    mVar31 = 0;
    local_260 = this_00;
    face_table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         face_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (pEVar28 = (pOVar33->edges).
                   super__Vector_base<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                   ._M_impl.super__Vector_impl_data._M_start; pEVar28 != pEVar4;
        pEVar28 = pEVar28 + 1) {
      pmVar22 = std::
                map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                ::operator[](&face_table,pEVar28->edge + 2);
      *pmVar22 = mVar31;
      pmVar22 = std::
                map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                ::operator[](&face_table,pEVar28->edge + 3);
      *pmVar22 = mVar31;
      mVar31 = mVar31 + 1;
    }
    this_01 = (aiMesh *)operator_new(0x520);
    aiMesh::aiMesh(this_01);
    uVar17 = (uint)face_table._M_t._M_impl.super__Rb_tree_header._M_node_count;
    lVar27 = CONCAT44(face_table._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
                      (uint)face_table._M_t._M_impl.super__Rb_tree_header._M_node_count);
    this_01->mNumFaces = (uint)face_table._M_t._M_impl.super__Rb_tree_header._M_node_count;
    uVar21 = (ulong)(uint)face_table._M_t._M_impl.super__Rb_tree_header._M_node_count;
    puVar23 = (ulong *)operator_new__(uVar21 * 0x10 + 8);
    *puVar23 = uVar21;
    paVar30 = (aiFace *)(puVar23 + 1);
    if (uVar17 != 0) {
      paVar24 = paVar30;
      do {
        paVar24->mNumIndices = 0;
        paVar24->mIndices = (uint *)0x0;
        paVar24 = paVar24 + 1;
      } while (paVar24 != paVar30 + uVar21);
    }
    this_01->mFaces = paVar30;
    if (vertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        vertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_start) {
      vertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish =
           vertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
              (&vertices,lVar27 << 2);
    p_Var26 = face_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (paVar7 = vertices.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish,
          __src = vertices.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start,
          (_Rb_tree_header *)p_Var26 != &face_table._M_t._M_impl.super__Rb_tree_header) {
      if (indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      _Var1 = p_Var26[1]._M_color;
      uVar17 = *(uint *)&p_Var26[1].field_0x4;
      do {
        pEVar28 = (pOVar33->edges).
                  super__Vector_base<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar21 = (ulong)(_Var1 == pEVar28[uVar17].edge[3]);
        uVar32 = pEVar28[uVar17].edge[uVar21];
        uVar17 = pEVar28[uVar17].edge[uVar21 + 4];
        local_264 = (uint)(((long)vertices.
                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)vertices.
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0xc);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&indices,&local_264);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  (&vertices,
                   &(pOVar33->vertices).
                    super__Vector_base<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar32].val);
        puVar8 = indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        __src_00 = indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
      } while (uVar17 != *(uint *)&p_Var26[1].field_0x4);
      uVar21 = (long)indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_start;
      paVar30->mNumIndices = (uint)(uVar21 >> 2);
      puVar25 = (uint *)operator_new__(uVar21 & 0x3fffffffc);
      paVar30->mIndices = puVar25;
      if (puVar8 != __src_00) {
        memmove(puVar25,__src_00,uVar21);
      }
      p_Var26 = (_Base_ptr)std::_Rb_tree_increment(p_Var26);
      paVar30 = paVar30 + 1;
    }
    __n = (long)vertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)vertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
    uVar21 = (long)__n / 0xc;
    uVar17 = (uint)uVar21;
    this_01->mNumVertices = uVar17;
    uVar21 = uVar21 & 0xffffffff;
    uVar29 = uVar21 * 0xc;
    __s_01 = (aiVector3D *)operator_new__(uVar29);
    if (uVar21 != 0) {
      uVar29 = uVar29 - 0xc;
      memset(__s_01,0,(uVar29 - uVar29 % 0xc) + 0xc);
    }
    this_01->mVertices = __s_01;
    if (paVar7 != __src) {
      memmove(__s_01,__src,__n);
    }
    if (uVar17 == 0) {
      aiMesh::~aiMesh(this_01);
      operator_delete(this_01,0x520);
    }
    else {
      pScene->mMeshes[pScene->mNumMeshes] = this_01;
      uVar17 = pScene->mNumMeshes;
      pScene->mNumMeshes = uVar17 + 1;
      local_260->mNumMeshes = 1;
      puVar25 = (uint *)operator_new__(4);
      local_260->mMeshes = puVar25;
      *puVar25 = uVar17;
    }
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::~_Rb_tree(&face_table._M_t);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
            (&vertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
  std::vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>::~vector
            (&objects);
  StreamReader<true,_false>::~StreamReader(&reader);
  return;
}

Assistant:

void NDOImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    StreamReaderBE reader(pIOHandler->Open( pFile, "rb"));

    // first 9 bytes are nendo file format ("nendo 1.n")
    const char* head = (const char*)reader.GetPtr();
    reader.IncPtr(9);

    if (strncmp("nendo ",head,6)) {
        throw DeadlyImportError("Not a Nendo file; magic signature missing");
    }
    // check if this is a supported version. if not, continue, too -- users,
    // please don't complain if it doesn't work then ...
    unsigned int file_format = 12;
    if (!strncmp("1.0",head+6,3)) {
        file_format = 10;
        ASSIMP_LOG_INFO("NDO file format is 1.0");
    }
    else if (!strncmp("1.1",head+6,3)) {
        file_format = 11;
        ASSIMP_LOG_INFO("NDO file format is 1.1");
    }
    else if (!strncmp("1.2",head+6,3)) {
        file_format = 12;
        ASSIMP_LOG_INFO("NDO file format is 1.2");
    }
    else {
        ASSIMP_LOG_WARN_F( "Unrecognized nendo file format version, continuing happily ... :", (head+6));
    }

    reader.IncPtr(2); /* skip flags */
    if (file_format >= 12) {
        reader.IncPtr(2);
    }
    unsigned int temp = reader.GetU1();

    std::vector<Object> objects(temp); /* buffer to store all the loaded objects in */

    // read all objects
    for (unsigned int o = 0; o < objects.size(); ++o) {

//      if (file_format < 12) {
            if (!reader.GetI1()) {
                continue; /* skip over empty object */
            }
        //  reader.GetI2();
//      }
        Object& obj = objects[o];

        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        head = (const char*)reader.GetPtr();
        reader.IncPtr(temp + 76); /* skip unknown stuff */

        obj.name = std::string(head, temp);

        // read edge table
        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        obj.edges.reserve(temp);
        for (unsigned int e = 0; e < temp; ++e) {

            obj.edges.push_back(Edge());
            Edge& edge = obj.edges.back();

            for (unsigned int i = 0; i< 8; ++i) {
                edge.edge[i] = file_format >= 12 ? reader.GetU4() : reader.GetU2();
            }
            edge.hard =  file_format >= 11 ? reader.GetU1() : 0;
            for (unsigned int i = 0; i< 8; ++i) {
                edge.color[i] = reader.GetU1();
            }
        }

        // read face table
        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        obj.faces.reserve(temp);
        for (unsigned int e = 0; e < temp; ++e) {

            obj.faces.push_back(Face());
            Face& face = obj.faces.back();

            face.elem = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        }

        // read vertex table
        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        obj.vertices.reserve(temp);
        for (unsigned int e = 0; e < temp; ++e) {

            obj.vertices.push_back(Vertex());
            Vertex& v = obj.vertices.back();

            v.num = file_format >= 12 ? reader.GetU4() : reader.GetU2();
            v.val.x = reader.GetF4();
            v.val.y = reader.GetF4();
            v.val.z = reader.GetF4();
        }

        // read UVs
        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        for (unsigned int e = 0; e < temp; ++e) {
             file_format >= 12 ? reader.GetU4() : reader.GetU2();
        }

        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        for (unsigned int e = 0; e < temp; ++e) {
             file_format >= 12 ? reader.GetU4() : reader.GetU2();
        }

        if (reader.GetU1()) {
            const unsigned int x = reader.GetU2(), y = reader.GetU2();
            temp = 0;
            while (temp < x*y)  {
                unsigned int repeat = reader.GetU1();
                reader.GetU1();
                reader.GetU1();
                reader.GetU1();
                temp += repeat;
            }
        }
    }

    // construct a dummy node graph and add all named objects as child nodes
    aiNode* root = pScene->mRootNode = new aiNode("$NDODummyRoot");
    aiNode** cc = root->mChildren = new aiNode* [ root->mNumChildren = static_cast<unsigned int>( objects.size()) ] ();
    pScene->mMeshes = new aiMesh* [ root->mNumChildren] ();

    std::vector<aiVector3D> vertices;
    std::vector<unsigned int> indices;

    for(const Object& obj : objects) {
        aiNode* nd = *cc++ = new aiNode(obj.name);
        nd->mParent = root;

        // translated from a python dict() - a vector might be sufficient as well
        typedef std::map<unsigned int, unsigned int>  FaceTable;
        FaceTable face_table;

        unsigned int n = 0;
        for(const Edge& edge : obj.edges) {

            face_table[edge.edge[2]] = n;
            face_table[edge.edge[3]] = n;

            ++n;
        }

        aiMesh* mesh = new aiMesh();
        mesh->mNumFaces=static_cast<unsigned int>(face_table.size());
        aiFace* faces = mesh->mFaces = new aiFace[mesh->mNumFaces];

        vertices.clear();
        vertices.reserve(4 * face_table.size()); // arbitrarily chosen
        for(FaceTable::value_type& v : face_table) {
            indices.clear();

            aiFace& f = *faces++;

            const unsigned int key = v.first;
            unsigned int cur_edge = v.second;
            while (1) {
                unsigned int next_edge, next_vert;
                if (key == obj.edges[cur_edge].edge[3]) {
                    next_edge = obj.edges[cur_edge].edge[5];
                    next_vert = obj.edges[cur_edge].edge[1];
                }
                else {
                    next_edge = obj.edges[cur_edge].edge[4];
                    next_vert = obj.edges[cur_edge].edge[0];
                }
                indices.push_back( static_cast<unsigned int>(vertices.size()) );
                vertices.push_back(obj.vertices[ next_vert ].val);

                cur_edge = next_edge;
                if (cur_edge == v.second) {
                    break;
                }
            }

            f.mIndices = new unsigned int[f.mNumIndices = static_cast<unsigned int>(indices.size())];
            std::copy(indices.begin(),indices.end(),f.mIndices);
        }

        mesh->mVertices = new aiVector3D[mesh->mNumVertices = static_cast<unsigned int>(vertices.size())];
        std::copy(vertices.begin(),vertices.end(),mesh->mVertices);

        if (mesh->mNumVertices) {
            pScene->mMeshes[pScene->mNumMeshes] = mesh;

            (nd->mMeshes = new unsigned int[nd->mNumMeshes=1])[0]=pScene->mNumMeshes++;
        }else
            delete mesh;
    }
}